

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O2

JL_STATUS JlGetObjectFromDictionaryByKey
                    (JlDataObject *DictionaryObject,char *KeyName,JlDataObject **pObject)

{
  JL_STATUS JVar1;
  int iVar2;
  char *key;
  JlDataObject *object;
  JlDataObject **local_40;
  JlDictionaryItem *enumerator;
  
  enumerator = (JlDictionaryItem *)0x0;
  if (pObject == (JlDataObject **)0x0 ||
      (KeyName == (char *)0x0 || DictionaryObject == (JlDataObject *)0x0)) {
    JVar1 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pObject = (JlDataObject *)0x0;
    JVar1 = JL_STATUS_SUCCESS;
    local_40 = pObject;
    do {
      if (JVar1 != JL_STATUS_SUCCESS) {
        if (JVar1 == JL_STATUS_END_OF_DATA) {
          return JL_STATUS_NOT_FOUND;
        }
        return JVar1;
      }
      object = (JlDataObject *)0x0;
      key = (char *)0x0;
      JVar1 = JlGetObjectDictionaryNextItem(DictionaryObject,&object,&key,&enumerator);
    } while ((JVar1 != JL_STATUS_SUCCESS) || (iVar2 = strcmp(key,KeyName), iVar2 != 0));
    *local_40 = object;
    JVar1 = JL_STATUS_SUCCESS;
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlGetObjectFromDictionaryByKey
    (
        JlDataObject const*         DictionaryObject,
        char const*                 KeyName,
        JlDataObject**              pObject
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;
    JlDictionaryItem* enumerator = NULL;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  NULL != pObject )
    {
        *pObject = NULL;

        while( JL_STATUS_SUCCESS == jlStatus )
        {
            JlDataObject* object = NULL;
            char const* key = NULL;

            jlStatus = JlGetObjectDictionaryNextItem( DictionaryObject, &object, &key, &enumerator );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                if( strcmp( key, KeyName ) == 0 )
                {
                    // Found
                    *pObject = object;
                    break;
                }
            }
        }

        if( JL_STATUS_END_OF_DATA == jlStatus )
        {
            // This means we got to end of dictionary and did not find the key
            jlStatus = JL_STATUS_NOT_FOUND;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}